

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O3

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitStructNew
          (SubtypingDiscoverer<NullFixer> *this,StructNew *curr)

{
  Type *this_00;
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  Struct *pSVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  HeapType local_40;
  SubtypingDiscoverer<NullFixer> *local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
  local_38 = this;
  bVar3 = wasm::Type::isStruct(this_00);
  if ((bVar3) &&
     ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0)) {
    local_40 = wasm::Type::getHeapType(this_00);
    pSVar4 = HeapType::getStruct(&local_40);
    pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar5 = (long)pFVar2 - (long)pFVar1 >> 4;
    if (sVar5 != (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtype-exprs.h"
                    ,0x13a,
                    "void wasm::SubtypingDiscoverer<NullFixer>::visitStructNew(StructNew *) [SubType = NullFixer]"
                   );
    }
    if (pFVar2 != pFVar1) {
      local_38 = local_38 + -0x58;
      lVar6 = 0;
      uVar7 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar7) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
        Type_(local_38,(curr->operands).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data[uVar7],
              (Type)*(uintptr_t *)
                     ((long)&(((pSVar4->fields).
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_start)->type).id + lVar6));
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (sVar5 + (sVar5 == 0) != uVar7);
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (!curr->type.isStruct() || curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0, size = fields.size(); i < size; ++i) {
      self()->noteSubtype(curr->operands[i], fields[i].type);
    }
  }